

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrTsim.c
# Opt level: O2

int Pdr_ManSimDataInit(Aig_Man_t *pAig,Vec_Int_t *vCiObjs,Vec_Int_t *vCiVals,Vec_Int_t *vNodes,
                      Vec_Int_t *vCoObjs,Vec_Int_t *vCoVals,Vec_Int_t *vCi2Rem)

{
  int iVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  int iVar4;
  
  Pdr_ManSimInfoSet(pAig,pAig->pConst1,2);
  for (iVar4 = 0; iVar4 < vCiObjs->nSize; iVar4 = iVar4 + 1) {
    iVar1 = Vec_IntEntry(vCiObjs,iVar4);
    pAVar3 = Aig_ManObj(pAig,iVar1);
    iVar1 = Vec_IntEntry(vCiVals,iVar4);
    Pdr_ManSimInfoSet(pAig,pAVar3,2 - (uint)(iVar1 == 0));
  }
  if (vCi2Rem != (Vec_Int_t *)0x0) {
    for (iVar4 = 0; iVar4 < vCi2Rem->nSize; iVar4 = iVar4 + 1) {
      iVar1 = Vec_IntEntry(vCi2Rem,iVar4);
      pAVar3 = Aig_ManObj(pAig,iVar1);
      Pdr_ManSimInfoSet(pAig,pAVar3,3);
    }
  }
  for (iVar4 = 0; iVar4 < vNodes->nSize; iVar4 = iVar4 + 1) {
    iVar1 = Vec_IntEntry(vNodes,iVar4);
    pAVar3 = Aig_ManObj(pAig,iVar1);
    Pdr_ManExtendOneEval(pAig,pAVar3);
  }
  for (iVar4 = 0; iVar4 < vCoObjs->nSize; iVar4 = iVar4 + 1) {
    iVar1 = Vec_IntEntry(vCoObjs,iVar4);
    pAVar3 = Aig_ManObj(pAig,iVar1);
    Pdr_ManExtendOneEval(pAig,pAVar3);
  }
  iVar4 = 0;
  do {
    if (vCoObjs->nSize <= iVar4) {
      return 1;
    }
    iVar1 = Vec_IntEntry(vCoObjs,iVar4);
    pAVar3 = Aig_ManObj(pAig,iVar1);
    iVar1 = Pdr_ManSimInfoGet(pAig,pAVar3);
    iVar2 = Vec_IntEntry(vCoVals,iVar4);
    iVar4 = iVar4 + 1;
  } while (iVar1 == 2 - (uint)(iVar2 == 0));
  return 0;
}

Assistant:

int Pdr_ManSimDataInit( Aig_Man_t * pAig,
    Vec_Int_t * vCiObjs, Vec_Int_t * vCiVals, Vec_Int_t * vNodes,
    Vec_Int_t * vCoObjs, Vec_Int_t * vCoVals, Vec_Int_t * vCi2Rem )
{
    Aig_Obj_t * pObj;
    int i;
    // set the CI values
    Pdr_ManSimInfoSet( pAig, Aig_ManConst1(pAig), PDR_ONE );
    Aig_ManForEachObjVec( vCiObjs, pAig, pObj, i )
        Pdr_ManSimInfoSet( pAig, pObj, (Vec_IntEntry(vCiVals, i)?PDR_ONE:PDR_ZER) );
    // set the FOs to remove
    if ( vCi2Rem != NULL )
    Aig_ManForEachObjVec( vCi2Rem, pAig, pObj, i )
        Pdr_ManSimInfoSet( pAig, pObj, PDR_UND );
    // perform ternary simulation
    Aig_ManForEachObjVec( vNodes, pAig, pObj, i )
        Pdr_ManExtendOneEval( pAig, pObj );
    // transfer results to the output
    Aig_ManForEachObjVec( vCoObjs, pAig, pObj, i )
        Pdr_ManExtendOneEval( pAig, pObj );
    // check the results
    Aig_ManForEachObjVec( vCoObjs, pAig, pObj, i )
        if ( Pdr_ManSimInfoGet( pAig, pObj ) != (Vec_IntEntry(vCoVals, i)?PDR_ONE:PDR_ZER) )
            return 0;
    return 1;
}